

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int ConnectPololux(POLOLU *pPololu,char *szCfgFilePath)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (addrsPololu[lVar2] == (void *)0x0) {
      iVar1 = ConnectPololu(pPololu,szCfgFilePath);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsPololu[lVar2] = pPololu;
      return 0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int ConnectPololux(POLOLU* pPololu, char* szCfgFilePath)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsPololu[id] != NULL)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = ConnectPololu(pPololu, szCfgFilePath);
	if (res != EXIT_SUCCESS) return res;

	addrsPololu[id] = pPololu;

	return EXIT_SUCCESS;
}